

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_dict_big(void)

{
  int iVar1;
  uint uVar2;
  VALUE *pVVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  VALUE d;
  char key [32];
  VALUE VStack_68;
  char local_58 [40];
  
  value_init_dict(&VStack_68);
  uVar6 = 0;
  do {
    sprintf(local_58,"%d",uVar6);
    pVVar3 = value_dict_get_or_add(&VStack_68,local_58);
    uVar5 = 0;
    if (pVVar3 != (VALUE *)0x0) {
      iVar1 = value_init_int32(pVVar3,(int)uVar6);
      uVar5 = (uint)(iVar1 == 0);
    }
    acutest_check_(uVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x346,"%s","v != NULL && value_init_int32(v, i) == 0");
    uVar5 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar5;
  } while (uVar5 != 100000);
  sVar4 = value_dict_size(&VStack_68);
  acutest_check_((uint)(sVar4 == 100000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x348,"%s","value_dict_size(&d) == N");
  uVar5 = 0;
  do {
    sprintf(local_58,"%d",(ulong)uVar5);
    pVVar3 = value_dict_get(&VStack_68,local_58);
    uVar2 = 0;
    if (pVVar3 != (VALUE *)0x0) {
      uVar2 = value_int32(pVVar3);
      uVar2 = (uint)(uVar5 == uVar2);
    }
    acutest_check_(uVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x34c,"%s","v != NULL && value_int32(v) == i");
    uVar5 = uVar5 + 1;
  } while (uVar5 != 100000);
  iVar1 = value_dict_verify(&VStack_68);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x34e,"%s","value_dict_verify(&d) == 0");
  value_dict_clean(&VStack_68);
  sVar4 = value_dict_size(&VStack_68);
  acutest_check_((uint)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x350,"%s","value_dict_size(&d) == 0");
  value_fini(&VStack_68);
  return;
}

Assistant:

static void
test_dict_big(void)
{
    const int N = 100000;

    VALUE d;
    VALUE* v;
    int i;
    char key[32];

    value_init_dict(&d);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get_or_add(&d, key);
        TEST_CHECK(v != NULL  &&  value_init_int32(v, i) == 0);
    }
    TEST_CHECK(value_dict_size(&d) == N);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get(&d, key);
        TEST_CHECK(v != NULL  &&  value_int32(v) == i);
    }
    TEST_CHECK(value_dict_verify(&d) == 0);
    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);
}